

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

void CGL::Collada::ColladaParser::parse_light(XMLElement *xml,LightInfo *light)

{
  bool bVar1;
  char *pcVar2;
  string *Vector3D_string;
  XMLElement *pXVar3;
  undefined4 *in_RSI;
  double dVar4;
  string color_string_4;
  XMLElement *e_quadratic_att_1;
  XMLElement *e_linear_att_1;
  XMLElement *e_constant_att_1;
  XMLElement *e_falloff_exp;
  XMLElement *e_falloff_deg;
  XMLElement *e_color_4;
  string color_string_3;
  XMLElement *e_quadratic_att;
  XMLElement *e_linear_att;
  XMLElement *e_constant_att;
  XMLElement *e_color_3;
  string color_string_2;
  XMLElement *e_color_2;
  string color_string_1;
  XMLElement *e_color_1;
  string color_string;
  XMLElement *e_color;
  string type;
  XMLElement *e_light;
  XMLElement *technique_CGL;
  XMLElement *technique_common;
  XMLElement *technique;
  XMLElement *in_stack_fffffffffffff958;
  XMLNode *in_stack_fffffffffffff960;
  XMLElement *in_stack_fffffffffffff968;
  XMLElement *in_stack_fffffffffffff9b8;
  XMLElement *in_stack_fffffffffffff9f8;
  string *in_stack_fffffffffffffb08;
  XMLElement *local_4c0;
  string local_4b8 [32];
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 uStack_480;
  allocator local_469;
  string local_468 [32];
  string *in_stack_fffffffffffffbb8;
  XMLElement *in_stack_fffffffffffffbc0;
  allocator local_411;
  string local_410 [32];
  XMLElement *local_3f0;
  allocator local_3e1;
  string local_3e0 [32];
  XMLElement *local_3c0;
  XMLElement *local_3b8;
  XMLElement *local_3b0;
  allocator local_3a1;
  string local_3a0 [32];
  XMLElement *local_380;
  string local_378 [32];
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 uStack_340;
  allocator local_329;
  string local_328 [39];
  allocator local_301;
  string local_300 [32];
  XMLElement *local_2e0;
  allocator local_2d1;
  string local_2d0 [32];
  XMLElement *local_2b0;
  allocator local_2a1;
  string local_2a0 [32];
  XMLElement *local_280;
  allocator local_271;
  string local_270 [32];
  XMLElement *local_250;
  string local_248 [32];
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [32];
  XMLElement *local_1b0;
  string local_1a8 [32];
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  XMLElement *local_110;
  string local_108 [32];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  XMLElement *local_70;
  allocator local_51;
  string local_50 [32];
  XMLElement *local_30;
  XMLElement *local_28;
  XMLElement *local_20;
  XMLElement *local_18;
  undefined4 *local_10;
  
  local_10 = in_RSI;
  pcVar2 = tinyxml2::XMLElement::Attribute
                     (in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960,
                      (char *)in_stack_fffffffffffff958);
  std::__cxx11::string::operator=((string *)(local_10 + 2),pcVar2);
  pcVar2 = tinyxml2::XMLElement::Attribute
                     (in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960,
                      (char *)in_stack_fffffffffffff958);
  std::__cxx11::string::operator=((string *)(local_10 + 10),pcVar2);
  *local_10 = 1;
  local_18 = (XMLElement *)0x0;
  local_20 = get_technique_common(in_stack_fffffffffffff9b8);
  local_28 = get_technique_CGL(in_stack_fffffffffffff9f8);
  local_4c0 = local_28;
  if (local_28 == (XMLElement *)0x0) {
    local_4c0 = local_20;
  }
  local_18 = local_4c0;
  if (local_4c0 == (XMLElement *)0x0) {
    exit(1);
  }
  local_30 = tinyxml2::XMLNode::FirstChildElement
                       (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
  if (local_30 != (XMLElement *)0x0) {
    pcVar2 = tinyxml2::XMLElement::Name((XMLElement *)0x121b8a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,pcVar2,&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
    if (bVar1) {
      local_10[0x12] = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"color",&local_91);
      pXVar3 = get_element(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      local_70 = pXVar3;
      if (pXVar3 == (XMLElement *)0x0) {
        exit(1);
      }
      Vector3D_string = (string *)tinyxml2::XMLElement::GetText(in_stack_fffffffffffff958);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,(char *)Vector3D_string,&local_b9);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      std::__cxx11::string::string(local_108,local_b8);
      spectrum_from_string(Vector3D_string);
      *(undefined8 *)(local_10 + 0x14) = local_e8;
      *(undefined8 *)(local_10 + 0x16) = local_e0;
      *(undefined8 *)(local_10 + 0x18) = local_d8;
      *(undefined8 *)(local_10 + 0x1a) = local_d0;
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_b8);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
      if (bVar1) {
        local_10[0x12] = 2;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_130,"color",&local_131);
        pXVar3 = get_element(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
        std::__cxx11::string::~string(local_130);
        std::allocator<char>::~allocator((allocator<char> *)&local_131);
        local_110 = pXVar3;
        if (pXVar3 == (XMLElement *)0x0) {
          exit(1);
        }
        pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff958);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_158,pcVar2,&local_159);
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
        std::__cxx11::string::string(local_1a8,local_158);
        spectrum_from_string(in_stack_fffffffffffffb08);
        *(undefined8 *)(local_10 + 0x14) = local_188;
        *(undefined8 *)(local_10 + 0x16) = local_180;
        *(undefined8 *)(local_10 + 0x18) = local_178;
        *(undefined8 *)(local_10 + 0x1a) = local_170;
        std::__cxx11::string::~string(local_1a8);
        std::__cxx11::string::~string(local_158);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
        if (bVar1) {
          local_10[0x12] = 3;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1d0,"color",&local_1d1);
          pXVar3 = get_element(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
          std::__cxx11::string::~string(local_1d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
          local_1b0 = pXVar3;
          if (pXVar3 == (XMLElement *)0x0) {
            exit(1);
          }
          pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff958);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1f8,pcVar2,&local_1f9);
          std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
          std::__cxx11::string::string(local_248,local_1f8);
          spectrum_from_string(in_stack_fffffffffffffb08);
          *(undefined8 *)(local_10 + 0x14) = local_228;
          *(undefined8 *)(local_10 + 0x16) = local_220;
          *(undefined8 *)(local_10 + 0x18) = local_218;
          *(undefined8 *)(local_10 + 0x1a) = local_210;
          std::__cxx11::string::~string(local_248);
          std::__cxx11::string::~string(local_1f8);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
          if (bVar1) {
            local_10[0x12] = 4;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_270,"color",&local_271);
            pXVar3 = get_element(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
            std::__cxx11::string::~string(local_270);
            std::allocator<char>::~allocator((allocator<char> *)&local_271);
            local_250 = pXVar3;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2a0,"constant_attenuation",&local_2a1);
            pXVar3 = get_element(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
            std::__cxx11::string::~string(local_2a0);
            std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
            local_280 = pXVar3;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2d0,"linear_attenuation",&local_2d1);
            pXVar3 = get_element(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
            std::__cxx11::string::~string(local_2d0);
            std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
            local_2b0 = pXVar3;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_300,"quadratic_attenuation",&local_301);
            pXVar3 = get_element(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
            std::__cxx11::string::~string(local_300);
            std::allocator<char>::~allocator((allocator<char> *)&local_301);
            local_2e0 = pXVar3;
            if ((((local_250 == (XMLElement *)0x0) || (local_280 == (XMLElement *)0x0)) ||
                (local_2b0 == (XMLElement *)0x0)) || (pXVar3 == (XMLElement *)0x0)) {
              exit(1);
            }
            pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff958);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_328,pcVar2,&local_329);
            std::allocator<char>::~allocator((allocator<char> *)&local_329);
            std::__cxx11::string::string(local_378,local_328);
            spectrum_from_string(in_stack_fffffffffffffb08);
            *(undefined8 *)(local_10 + 0x14) = local_358;
            *(undefined8 *)(local_10 + 0x16) = uStack_350;
            *(undefined8 *)(local_10 + 0x18) = uStack_348;
            *(undefined8 *)(local_10 + 0x1a) = uStack_340;
            std::__cxx11::string::~string(local_378);
            pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff958);
            dVar4 = atof(pcVar2);
            local_10[0x36] = (float)dVar4;
            pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff958);
            dVar4 = atof(pcVar2);
            local_10[0x36] = (float)dVar4;
            pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff958);
            dVar4 = atof(pcVar2);
            local_10[0x36] = (float)dVar4;
            std::__cxx11::string::~string(local_328);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
            if (!bVar1) {
              exit(1);
            }
            local_10[0x12] = 5;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_3a0,"color",&local_3a1);
            pXVar3 = get_element(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
            std::__cxx11::string::~string(local_3a0);
            std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
            local_380 = pXVar3;
            local_3b0 = tinyxml2::XMLNode::FirstChildElement
                                  (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
            local_3b8 = tinyxml2::XMLNode::FirstChildElement
                                  (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_3e0,"constant_attenuation",&local_3e1);
            pXVar3 = get_element(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
            std::__cxx11::string::~string(local_3e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
            local_3c0 = pXVar3;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_410,"linear_attenuation",&local_411);
            pXVar3 = get_element(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
            std::__cxx11::string::~string(local_410);
            std::allocator<char>::~allocator((allocator<char> *)&local_411);
            local_3f0 = pXVar3;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&stack0xfffffffffffffbc0,"quadratic_attenuation",
                       (allocator *)&stack0xfffffffffffffbbf);
            pXVar3 = get_element(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffbc0);
            std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbbf);
            if ((((local_380 == (XMLElement *)0x0) || (local_3b0 == (XMLElement *)0x0)) ||
                ((local_3b8 == (XMLElement *)0x0 ||
                 ((local_3c0 == (XMLElement *)0x0 || (local_3f0 == (XMLElement *)0x0)))))) ||
               (pXVar3 == (XMLElement *)0x0)) {
              exit(1);
            }
            pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff958);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_468,pcVar2,&local_469);
            std::allocator<char>::~allocator((allocator<char> *)&local_469);
            std::__cxx11::string::string(local_4b8,local_468);
            spectrum_from_string(in_stack_fffffffffffffb08);
            *(undefined8 *)(local_10 + 0x14) = local_498;
            *(undefined8 *)(local_10 + 0x16) = uStack_490;
            *(undefined8 *)(local_10 + 0x18) = uStack_488;
            *(undefined8 *)(local_10 + 0x1a) = uStack_480;
            std::__cxx11::string::~string(local_4b8);
            pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff958);
            dVar4 = atof(pcVar2);
            local_10[0x36] = (float)dVar4;
            pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff958);
            dVar4 = atof(pcVar2);
            local_10[0x36] = (float)dVar4;
            pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff958);
            dVar4 = atof(pcVar2);
            local_10[0x36] = (float)dVar4;
            pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff958);
            dVar4 = atof(pcVar2);
            local_10[0x36] = (float)dVar4;
            pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff958);
            dVar4 = atof(pcVar2);
            local_10[0x36] = (float)dVar4;
            std::__cxx11::string::~string(local_468);
          }
        }
      }
    }
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void ColladaParser::parse_light( XMLElement* xml, LightInfo& light ) {

  // name & id
  light.id   = xml->Attribute( "id" );
  light.name = xml->Attribute("name");
  light.type = Instance::LIGHT;

  XMLElement* technique = NULL;
  XMLElement* technique_common = get_technique_common(xml);
  XMLElement* technique_CGL = get_technique_CGL(xml);

  technique = technique_CGL ? technique_CGL : technique_common;
  if (!technique) {
    stat("Error: No supported profile defined in light: " << light.id);
    exit(EXIT_FAILURE);
  }

  // light parameters
  XMLElement* e_light = technique->FirstChildElement();
  if (e_light) {

    // type
    string type = e_light->Name();

    // type-specific parameters
    if (type == "ambient") {
      light.light_type = LightType::AMBIENT;
      XMLElement* e_color = get_element(e_light, "color");
      if (e_color) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string( color_string );
      } else {
        stat("Error: No color definition in ambient light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "directional") {
      light.light_type = LightType::DIRECTIONAL;
      XMLElement* e_color = get_element(e_light, "color");
      if (e_color) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string( color_string );
      } else {
        stat("Error: No color definition in directional light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "area") {
      light.light_type = LightType::AREA;
      XMLElement* e_color = get_element(e_light, "color");
      if (e_color) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string( color_string );
      } else {
        stat("Error: No color definition in area light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "point") {
      light.light_type = LightType::POINT;
      XMLElement* e_color = get_element(e_light, "color");
      XMLElement* e_constant_att = get_element(e_light, "constant_attenuation");
      XMLElement* e_linear_att = get_element(e_light, "linear_attenuation");
      XMLElement* e_quadratic_att = get_element(e_light, "quadratic_attenuation");
      if (e_color && e_constant_att && e_linear_att && e_quadratic_att) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string( color_string );
        light.constant_att = atof(e_constant_att->GetText());
        light.constant_att = atof(e_linear_att->GetText());
        light.constant_att = atof(e_quadratic_att->GetText());
      } else {
        stat("Error: incomplete definition of point light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "spot") {
      light.light_type = LightType::SPOT;
      XMLElement* e_color = get_element(e_light, "color");
      XMLElement* e_falloff_deg = e_light->FirstChildElement("falloff_angle");
      XMLElement* e_falloff_exp = e_light->FirstChildElement("falloff_exponent");
      XMLElement* e_constant_att = get_element(e_light, "constant_attenuation");
      XMLElement* e_linear_att = get_element(e_light, "linear_attenuation");
      XMLElement* e_quadratic_att = get_element(e_light, "quadratic_attenuation");
      if (e_color && e_falloff_deg && e_falloff_exp &&
          e_constant_att && e_linear_att && e_quadratic_att) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string( color_string );
        light.constant_att = atof(e_falloff_deg->GetText());
        light.constant_att = atof(e_falloff_exp->GetText());
        light.constant_att = atof(e_constant_att->GetText());
        light.constant_att = atof(e_linear_att->GetText());
        light.constant_att = atof(e_quadratic_att->GetText());
      } else {
        stat("Error: incomplete definition of spot light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else {
      stat("Error: Light type " << type << " in light: " << light.id << "is not supported");
      exit(EXIT_FAILURE);
    }

  }

  // print summary
  stat("  |- " << light);
}